

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRoundItem.h
# Opt level: O2

void __thiscall TimeRoundItem<channel>::~TimeRoundItem(TimeRoundItem<channel> *this)

{
  if (((this->ptr).super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && ((this->fun).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    std::function<void_()>::operator()(&this->fun);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->ptr).super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::_Function_base::~_Function_base(&(this->fun).super__Function_base);
  return;
}

Assistant:

~TimeRoundItem()
        {
            if(ptr && fun)
            {
                fun();
            }
        }